

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateConstructorCode
          (SingularStringView *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  LogMessage *pLVar3;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  Printer *local_18;
  Printer *p_local;
  SingularStringView *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
  if (((!bVar2) || (bVar2 = EmptyDefault(this), !bVar2)) &&
     (bVar2 = FieldGeneratorBase::is_oneof(&this->super_FieldGeneratorBase), !bVar2)) {
    bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
    local_31 = 0;
    if (bVar2) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field_generators/string_view_field.cc"
                 ,0x1dd,"!is_inlined()");
      local_31 = 1;
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
    }
    pPVar1 = local_18;
    if ((local_31 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"\n    $field_$.InitDefault();\n  ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_48._M_len,local_48._M_str);
    bVar2 = EmptyDefault(this);
    pPVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_60,
                 "\n      if ($pbi$::DebugHardenForceCopyDefaultString()) {\n        $field_$.Set(\"\", GetArena());\n      }\n    "
                );
      io::Printer::SourceLocation::current();
      io::Printer::Emit(pPVar1,local_60._M_len,local_60._M_str);
    }
  }
  return;
}

Assistant:

void SingularStringView::GenerateConstructorCode(io::Printer* p) const {
  if ((is_inlined() && EmptyDefault()) || is_oneof()) return;
  ABSL_DCHECK(!is_inlined());

  p->Emit(R"cc(
    $field_$.InitDefault();
  )cc");

  if (EmptyDefault()) {
    p->Emit(R"cc(
      if ($pbi$::DebugHardenForceCopyDefaultString()) {
        $field_$.Set("", GetArena());
      }
    )cc");
  }
}